

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int cipher_setup_crypto(ptls_cipher_context_t *_ctx,int is_enc,void *key,EVP_CIPHER *cipher,
                       _func_void_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *do_transform)

{
  int iVar1;
  EVP_CIPHER_CTX *ctx;
  
  _ctx->do_dispose = cipher_dispose;
  _ctx->do_init = cipher_do_init;
  _ctx->do_transform =
       (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)do_transform;
  ctx = EVP_CIPHER_CTX_new();
  _ctx[1].algo = (st_ptls_cipher_algorithm_t *)ctx;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    iVar1 = 0x201;
  }
  else {
    if (is_enc == 0) {
      iVar1 = EVP_DecryptInit_ex(ctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
      if (iVar1 != 0) {
        EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)_ctx[1].algo,0);
        return 0;
      }
    }
    else {
      iVar1 = EVP_EncryptInit_ex(ctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
      if (iVar1 != 0) {
        return 0;
      }
    }
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)_ctx[1].algo);
    iVar1 = 0x203;
  }
  return iVar1;
}

Assistant:

static int cipher_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key, const EVP_CIPHER *cipher,
                               void (*do_transform)(ptls_cipher_context_t *, void *, const void *, size_t))
{
    struct cipher_context_t *ctx = (struct cipher_context_t *)_ctx;

    ctx->super.do_dispose = cipher_dispose;
    ctx->super.do_init = cipher_do_init;
    ctx->super.do_transform = do_transform;

    if ((ctx->evp = EVP_CIPHER_CTX_new()) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if (is_enc) {
        if (!EVP_EncryptInit_ex(ctx->evp, cipher, NULL, key, NULL))
            goto Error;
    } else {
        if (!EVP_DecryptInit_ex(ctx->evp, cipher, NULL, key, NULL))
            goto Error;
        EVP_CIPHER_CTX_set_padding(ctx->evp, 0); /* required to disable one block buffering in ECB mode */
    }

    return 0;
Error:
    EVP_CIPHER_CTX_free(ctx->evp);
    return PTLS_ERROR_LIBRARY;
}